

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O0

newtRef NsBaseName(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  uint32_t len;
  char *pcVar2;
  char *base;
  newtRefArg r_local;
  newtRefArg rcvr_local;
  
  _Var1 = NewtRefIsString(r);
  if (_Var1) {
    pcVar2 = NewtRefToString(r);
    len = NewtStringLength(r);
    pcVar2 = NewtBaseName(pcVar2,len);
    rcvr_local = r;
    if (pcVar2 != (char *)0x0) {
      rcvr_local = NewtMakeString(pcVar2,false);
    }
  }
  else {
    rcvr_local = NewtThrow(-0xbd12,r);
  }
  return rcvr_local;
}

Assistant:

newtRef NsBaseName(newtRefArg rcvr, newtRefArg r)
{
    char *  base;
    
    if (! NewtRefIsString(r))
        return NewtThrow(kNErrNotAString, r);
    
    base = NewtBaseName(NewtRefToString(r), NewtStringLength(r));
    
    if (base != NULL)
        return NSSTR(base);
    else
        return r;
}